

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int increase_cache_usage(spng_ctx *ctx,size_t bytes,int new_chunk)

{
  ulong uVar1;
  size_t new_usage;
  int new_chunk_local;
  size_t bytes_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (bytes == 0)) {
    return 0x50;
  }
  if (new_chunk != 0) {
    ctx->chunk_count_total = ctx->chunk_count_total + 1;
    if (ctx->chunk_count_total == 0) {
      return 3;
    }
    if (ctx->chunk_count_limit < ctx->chunk_count_total) {
      return 0x4d;
    }
  }
  uVar1 = ctx->chunk_cache_usage + bytes;
  if (uVar1 < ctx->chunk_cache_usage) {
    ctx_local._4_4_ = 3;
  }
  else if (ctx->chunk_cache_limit < uVar1) {
    ctx_local._4_4_ = 0x4d;
  }
  else {
    ctx->chunk_cache_usage = uVar1;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int increase_cache_usage(spng_ctx *ctx, size_t bytes, int new_chunk)
{
    if(ctx == NULL || !bytes) return SPNG_EINTERNAL;

    if(new_chunk)
    {
        ctx->chunk_count_total++;
        if(ctx->chunk_count_total < 1) return SPNG_EOVERFLOW;

        if(ctx->chunk_count_total > ctx->chunk_count_limit) return SPNG_ECHUNK_LIMITS;
    }

    size_t new_usage = ctx->chunk_cache_usage + bytes;

    if(new_usage < ctx->chunk_cache_usage) return SPNG_EOVERFLOW;

    if(new_usage > ctx->chunk_cache_limit) return SPNG_ECHUNK_LIMITS;

    ctx->chunk_cache_usage = new_usage;

    return 0;
}